

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

size_t __thiscall
andres::View<int,_true,_std::allocator<unsigned_long>_>::elementAccessHelper<unsigned_long>
          (View<int,_true,_std::allocator<unsigned_long>_> *this,size_t Dim,size_t value,
          unsigned_long args)

{
  size_t sVar1;
  size_t sVar2;
  runtime_error *this_00;
  
  sVar1 = shape(this,Dim - 2);
  if (value < sVar1) {
    sVar1 = strides(this,Dim - 2);
    sVar2 = shape(this,Dim - 1);
    if (args < sVar2) {
      sVar2 = strides(this,Dim - 1);
      return sVar2 * args + sVar1 * value;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline std::size_t
View<T, isConst, A>::elementAccessHelper
(
    const std::size_t Dim, 
    const std::size_t value, 
    const Args... args
)
{
    marray_detail::Assert(MARRAY_NO_ARG_TEST || (value < shape(Dim-1-sizeof...(args)) ) );      
    return value * strides(Dim-1-sizeof...(args)) + elementAccessHelper(Dim, args...); 
}